

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

Converter * __thiscall
HawkTracer::client::Converter::_get_label_abi_cxx11_(Converter *this,Event *event)

{
  uint32_t uVar1;
  Event *pEVar2;
  bool bVar3;
  uint32_t uVar4;
  element_type *this_00;
  pointer this_01;
  ulong id;
  char *pcVar5;
  Event *in_RDX;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [40];
  string local_d8 [38];
  allocator local_b2;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  shared_ptr<const_HawkTracer::parser::EventKlass> local_48 [2];
  undefined1 local_21;
  Event *local_20;
  Event *event_local;
  Converter *this_local;
  string *label;
  
  local_21 = 0;
  local_20 = in_RDX;
  event_local = event;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  if (*(int *)(event + 0x30) == 0) {
    _try_setting_mapping_klass_id((Converter *)event,local_20);
  }
  else {
    parser::Event::get_klass((Event *)local_48);
    this_00 = std::
              __shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
    uVar4 = parser::EventKlass::get_id(this_00);
    uVar1 = *(uint32_t *)(event + 0x30);
    std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr(local_48);
    pEVar2 = local_20;
    if (uVar4 == uVar1) {
      this_01 = std::
                unique_ptr<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                ::operator->((unique_ptr<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                              *)(event + 8));
      pEVar2 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"identifier",&local_69);
      id = HawkTracer::parser::Event::get_value<unsigned_long>((string *)pEVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"label",&local_b1);
      pcVar5 = HawkTracer::parser::Event::get_value<char*>((string *)local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar5,&local_b2);
      TracepointMap::add_map_entry(this_01,id,(string *)local_90);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_b2);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"label",(allocator *)(local_100 + 0x27));
      bVar3 = parser::Event::has_value(pEVar2,(string *)local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0x27));
      pEVar2 = local_20;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,"label",&local_121);
        parser::Event::get_raw_value(local_20,(string *)local_120);
        _convert_value_to_string_abi_cxx11_((Converter *)local_100,(Value *)event);
        std::__cxx11::string::operator=((string *)this,(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_148,"name",&local_149);
        bVar3 = parser::Event::has_value(pEVar2,(string *)local_148);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,"name",&local_171);
          pcVar5 = HawkTracer::parser::Event::get_value<char*>((string *)local_20);
          std::__cxx11::string::operator=((string *)this,pcVar5);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
        }
      }
    }
  }
  return this;
}

Assistant:

std::string Converter::_get_label(const parser::Event& event)
{
    std::string label;

    if (_mapping_klass_id == 0)
    {
        _try_setting_mapping_klass_id(event);
    }
    else if (event.get_klass()->get_id() == _mapping_klass_id)
    {
        _tracepoint_map->add_map_entry(event.get_value<uint64_t>("identifier"), event.get_value<char*>("label"));
    } 
    else if (event.has_value("label"))
    {
        label = _convert_value_to_string(event.get_raw_value("label")); 
    }
    else if (event.has_value("name"))
    {
        label = event.get_value<char*>("name");
    }
    return label;
}